

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O2

int tlsio_openssl_setoption(CONCRETE_IO_HANDLE tls_io,char *optionName,void *value)

{
  int iVar1;
  OPTIONHANDLER_RESULT OVar2;
  size_t sVar3;
  LOGGER_LOG p_Var4;
  int iVar5;
  void *arg;
  SSL_CTX *ctx;
  char *pcVar6;
  size_t __size;
  _Bool *server_name_check;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 uVar7;
  
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (optionName == (char *)0x0 || tls_io == (CONCRETE_IO_HANDLE)0x0) {
    return 0x66a;
  }
  iVar1 = strcmp("TrustedCerts",optionName);
  if (iVar1 == 0) {
    if (*(void **)((long)tls_io + 0x70) != (void *)0x0) {
      free(*(void **)((long)tls_io + 0x70));
      *(undefined8 *)((long)tls_io + 0x70) = 0;
    }
    sVar3 = strlen((char *)value);
    __size = 0xffffffffffffffff;
    if (sVar3 + 1 != 0) {
      __size = sVar3 + 1;
    }
    if (__size != 0xffffffffffffffff) {
      pcVar6 = (char *)malloc(__size);
      *(char **)((long)tls_io + 0x70) = pcVar6;
      if (pcVar6 != (char *)0x0) {
        strcpy(pcVar6,(char *)value);
        iVar1 = 0;
        goto LAB_00110d31;
      }
    }
    p_Var4 = xlogging_get_log_function();
    iVar1 = 0x683;
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/tlsio_openssl.c"
                ,"tlsio_openssl_setoption",0x682,1,"malloc failure, size:%zu",__size);
    }
LAB_00110d31:
    if (*(long *)((long)tls_io + 0x50) != 0) {
      iVar1 = add_certificate_to_store((TLS_IO_INSTANCE *)tls_io,(char *)value);
      return iVar1;
    }
    return iVar1;
  }
  iVar1 = strcmp("CipherSuite",optionName);
  if (iVar1 == 0) {
    if (*(void **)((long)tls_io + 0x78) != (void *)0x0) {
      free(*(void **)((long)tls_io + 0x78));
      *(char **)((long)tls_io + 0x78) = (char *)0x0;
    }
    iVar1 = mallocAndStrcpy_s((char **)((long)tls_io + 0x78),(char *)value);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var4 = xlogging_get_log_function();
    iVar1 = 0x69e;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return 0x69e;
    }
    pcVar6 = "unable to mallocAndStrcpy_s %s";
    iVar5 = 0x69d;
LAB_00110fc9:
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/tlsio_openssl.c"
              ,"tlsio_openssl_setoption",iVar5,1,pcVar6);
    return iVar1;
  }
  iVar1 = strcmp("x509certificate",optionName);
  if ((iVar1 == 0) || (iVar1 = strcmp("x509EccCertificate",optionName), iVar1 == 0)) {
    if (*(long *)((long)tls_io + 0x80) == 0) {
      iVar1 = mallocAndStrcpy_s((char **)((long)tls_io + 0x80),(char *)value);
      if (iVar1 == 0) {
        return 0;
      }
      p_Var4 = xlogging_get_log_function();
      iVar1 = 0x6b2;
      if (p_Var4 == (LOGGER_LOG)0x0) {
        return 0x6b2;
      }
      pcVar6 = "unable to mallocAndStrcpy_s %s";
      iVar5 = 0x6b1;
    }
    else {
      p_Var4 = xlogging_get_log_function();
      iVar1 = 0x6aa;
      if (p_Var4 == (LOGGER_LOG)0x0) {
        return 0x6aa;
      }
      pcVar6 = "unable to set x509 options more than once";
      iVar5 = 0x6a9;
    }
    goto LAB_00110fc9;
  }
  iVar1 = strcmp("x509privatekey",optionName);
  if ((iVar1 == 0) || (iVar1 = strcmp("x509EccAliasKey",optionName), iVar1 == 0)) {
    if (*(long *)((long)tls_io + 0x88) == 0) {
      iVar1 = mallocAndStrcpy_s((char **)((long)tls_io + 0x88),(char *)value);
      if (iVar1 == 0) {
        return 0;
      }
      p_Var4 = xlogging_get_log_function();
      iVar1 = 0x6c7;
      if (p_Var4 == (LOGGER_LOG)0x0) {
        return 0x6c7;
      }
      pcVar6 = "unable to mallocAndStrcpy_s %s";
      iVar5 = 0x6c6;
    }
    else {
      p_Var4 = xlogging_get_log_function();
      iVar1 = 0x6bf;
      if (p_Var4 == (LOGGER_LOG)0x0) {
        return 0x6bf;
      }
      pcVar6 = "unable to set more than once x509 options";
      iVar5 = 0x6be;
    }
    goto LAB_00110fc9;
  }
  iVar1 = strcmp("Engine",optionName);
  if (iVar1 == 0) {
    ENGINE_load_builtin_engines();
    iVar1 = mallocAndStrcpy_s((char **)((long)tls_io + 0xb0),(char *)value);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var4 = xlogging_get_log_function();
    iVar1 = 0x6d7;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return 0x6d7;
    }
    pcVar6 = "unable to mallocAndStrcpy_s %s";
    iVar5 = 0x6d6;
    goto LAB_00110fc9;
  }
  iVar1 = strcmp("x509PrivatekeyType",optionName);
  if (iVar1 == 0) {
    if (*value < 2) {
      *(uint *)((long)tls_io + 200) = *value;
      return 0;
    }
    p_Var4 = xlogging_get_log_function();
    iVar1 = 0x6ec;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return 0x6ec;
    }
    pcVar6 = "Unknown x509PrivatekeyType type %d";
    iVar5 = 0x6eb;
    goto LAB_00110fc9;
  }
  iVar1 = strcmp("tls_validation_callback",optionName);
  if (iVar1 == 0) {
    *(void **)((long)tls_io + 0x98) = value;
    ctx = *(SSL_CTX **)((long)tls_io + 0x50);
    if (ctx == (SSL_CTX *)0x0) {
      return 0;
    }
    arg = *(void **)((long)tls_io + 0xa0);
LAB_00110f3b:
    SSL_CTX_set_cert_verify_callback(ctx,(cb *)value,arg);
    return 0;
  }
  iVar1 = strcmp("tls_validation_callback_data",optionName);
  if (iVar1 == 0) {
    *(void **)((long)tls_io + 0xa0) = value;
    ctx = *(SSL_CTX **)((long)tls_io + 0x50);
    if (ctx == (SSL_CTX *)0x0) {
      return 0;
    }
    arg = value;
    value = *(cb **)((long)tls_io + 0x98);
    goto LAB_00110f3b;
  }
  iVar1 = strcmp("tls_version",optionName);
  if (iVar1 != 0) {
    iVar1 = strcmp(optionName,"underlying_io_options");
    if (iVar1 != 0) {
      iVar1 = strcmp(optionName,"tls_renegotiation");
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = strcmp("ignore_host_name_check",optionName);
      if (iVar1 == 0) {
        *(undefined1 *)((long)tls_io + 0xb8) = *value;
        return 0;
      }
      if (*tls_io != (XIO_HANDLE)0x0) {
        iVar1 = xio_setoption(*tls_io,optionName,value);
        return iVar1;
      }
      return 0x745;
    }
    OVar2 = OptionHandler_FeedOptions((OPTIONHANDLER_HANDLE)value,*tls_io);
    if (OVar2 == OPTIONHANDLER_OK) {
      return 0;
    }
    p_Var4 = xlogging_get_log_function();
    iVar1 = 0x72f;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return 0x72f;
    }
    pcVar6 = "failed feeding options to underlying I/O instance";
    iVar5 = 0x72e;
    goto LAB_00110fc9;
  }
  if (*(long *)((long)tls_io + 0x50) != 0) {
    p_Var4 = xlogging_get_log_function();
    iVar1 = 0x711;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return 0x711;
    }
    pcVar6 = "Unable to set the tls version after the tls connection is established";
    iVar5 = 0x710;
    goto LAB_00110fc9;
  }
  iVar1 = *value;
  if (iVar1 == 0) {
LAB_00110ff3:
    *(undefined4 *)((long)tls_io + 0x90) = 10;
  }
  else {
    if (iVar1 != 0xc) {
      if (iVar1 == 0xb) {
        *(undefined4 *)((long)tls_io + 0x90) = 0xb;
        return 0;
      }
      if (iVar1 == 10) goto LAB_00110ff3;
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/tlsio_openssl.c"
                  ,"tlsio_openssl_setoption",0x724,1,
                  "Value of TLS version option %d is not found shall default to version 1.2",
                  CONCAT44(uVar7,iVar1));
      }
    }
    *(undefined4 *)((long)tls_io + 0x90) = 0xc;
  }
  return 0;
}

Assistant:

int tlsio_openssl_setoption(CONCRETE_IO_HANDLE tls_io, const char* optionName, const void* value)
{
    int result;

    if (tls_io == NULL || optionName == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        TLS_IO_INSTANCE* tls_io_instance = (TLS_IO_INSTANCE*)tls_io;

        if (strcmp(OPTION_TRUSTED_CERT, optionName) == 0)
        {
            const char* cert = (const char*)value;
            size_t len;

            if (tls_io_instance->certificate != NULL)
            {
                // Free the memory if it has been previously allocated
                free(tls_io_instance->certificate);
                tls_io_instance->certificate = NULL;
            }

            // Store the certificate
            len = strlen(cert);
            size_t malloc_size = safe_add_size_t(len, 1);
            if (malloc_size == SIZE_MAX ||
                (tls_io_instance->certificate = malloc(malloc_size)) == NULL)
            {
                LogError("malloc failure, size:%zu", malloc_size);
                result = MU_FAILURE;
            }
            else
            {
                strcpy(tls_io_instance->certificate, cert);
                result = 0;
            }

            // If we're previously connected then add the cert to the context
            if (tls_io_instance->ssl_context != NULL)
            {
                result = add_certificate_to_store(tls_io_instance, cert);
            }
        }
        else if (strcmp(OPTION_OPENSSL_CIPHER_SUITE, optionName) == 0)
        {
            if (tls_io_instance->cipher_list != NULL)
            {
                // Free the memory if it has been previously allocated
                free(tls_io_instance->cipher_list);
                tls_io_instance->cipher_list = NULL;
            }

            // Store the cipher suites
            if (mallocAndStrcpy_s((char**)&tls_io_instance->cipher_list, value) != 0)
            {
                LogError("unable to mallocAndStrcpy_s %s", optionName);
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }
        else if (strcmp(SU_OPTION_X509_CERT, optionName) == 0 || strcmp(OPTION_X509_ECC_CERT, optionName) == 0)
        {
            if (tls_io_instance->x509_certificate != NULL)
            {
                LogError("unable to set x509 options more than once");
                result = MU_FAILURE;
            }
            else
            {
                /*let's make a copy of this option*/
                if (mallocAndStrcpy_s((char**)&tls_io_instance->x509_certificate, value) != 0)
                {
                    LogError("unable to mallocAndStrcpy_s %s", optionName);
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }
            }
        }
        else if (strcmp(SU_OPTION_X509_PRIVATE_KEY, optionName) == 0 || strcmp(OPTION_X509_ECC_KEY, optionName) == 0)
        {
            if (tls_io_instance->x509_private_key != NULL)
            {
                LogError("unable to set more than once x509 options");
                result = MU_FAILURE;
            }
            else
            {
                /*let's make a copy of this option*/
                if (mallocAndStrcpy_s((char**)&tls_io_instance->x509_private_key, value) != 0)
                {
                    LogError("unable to mallocAndStrcpy_s %s", optionName);
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }
            }
        }
        #ifndef OPENSSL_NO_ENGINE
        else if (strcmp(OPTION_OPENSSL_ENGINE, optionName) == 0)
        {
            ENGINE_load_builtin_engines();

            if (mallocAndStrcpy_s((char**)&tls_io_instance->engine_id, value) != 0)
            {
                LogError("unable to mallocAndStrcpy_s %s", optionName);
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }
        #endif // OPENSSL_NO_ENGINE
        else if (strcmp(OPTION_OPENSSL_PRIVATE_KEY_TYPE, optionName) == 0)
        {
            const OPTION_OPENSSL_KEY_TYPE type = *(const OPTION_OPENSSL_KEY_TYPE*)value;
            switch (type)
            {
            case KEY_TYPE_DEFAULT:
            case KEY_TYPE_ENGINE:
                tls_io_instance->x509_private_key_type = type;
                result = 0;
                break;

            default:
                LogError("Unknown x509PrivatekeyType type %d", type);
                result = MU_FAILURE;
            }
        }
        else if (strcmp("tls_validation_callback", optionName) == 0)
        {
#ifdef WIN32
#pragma warning(push)
#pragma warning(disable:4055)
#endif // WIN32
            tls_io_instance->tls_validation_callback = (TLS_CERTIFICATE_VALIDATION_CALLBACK)value;
#ifdef WIN32
#pragma warning(pop)
#endif // WIN32

            if (tls_io_instance->ssl_context != NULL)
            {
                SSL_CTX_set_cert_verify_callback(tls_io_instance->ssl_context, tls_io_instance->tls_validation_callback, tls_io_instance->tls_validation_callback_data);
            }

            result = 0;
        }
        else if (strcmp("tls_validation_callback_data", optionName) == 0)
        {
            tls_io_instance->tls_validation_callback_data = (void*)value;

            if (tls_io_instance->ssl_context != NULL)
            {
                SSL_CTX_set_cert_verify_callback(tls_io_instance->ssl_context, tls_io_instance->tls_validation_callback, tls_io_instance->tls_validation_callback_data);
            }

            result = 0;
        }
        else if (strcmp(OPTION_TLS_VERSION, optionName) == 0)
        {
            if (tls_io_instance->ssl_context != NULL)
            {
                LogError("Unable to set the tls version after the tls connection is established");
                result = MU_FAILURE;
            }
            else
            {
                const int version_option = *(const int*)value;
                if (version_option == 0 || version_option == 10)
                {
                    tls_io_instance->tls_version = VERSION_1_0;
                }
                else if (version_option == 11)
                {
                    tls_io_instance->tls_version = VERSION_1_1;
                }
                else if (version_option == 12)
                {
                    tls_io_instance->tls_version = VERSION_1_2;
                }
                else
                {
                    LogInfo("Value of TLS version option %d is not found shall default to version 1.2", version_option);
                    tls_io_instance->tls_version = VERSION_1_2;
                }
                result = 0;
            }
        }
        else if (strcmp(optionName, OPTION_UNDERLYING_IO_OPTIONS) == 0)
        {
            if (OptionHandler_FeedOptions((OPTIONHANDLER_HANDLE)value, (void*)tls_io_instance->underlying_io) != OPTIONHANDLER_OK)
            {
                LogError("failed feeding options to underlying I/O instance");
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }
        else if (strcmp(optionName, OPTION_SET_TLS_RENEGOTIATION) == 0)
        {
            // No need to do anything for Openssl
            result = 0;
        }
        else if (strcmp("ignore_host_name_check", optionName) == 0)
        {
            bool* server_name_check = (bool*)value;
            tls_io_instance->ignore_host_name_check = *server_name_check;
            result = 0;
        }
        else
        {
            if (tls_io_instance->underlying_io == NULL)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = xio_setoption(tls_io_instance->underlying_io, optionName, value);
            }
        }
    }

    return result;
}